

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O0

void __thiscall
google::protobuf::io::CodedInputStream::CodedInputStream
          (CodedInputStream *this,ZeroCopyInputStream *input)

{
  ZeroCopyInputStream *input_local;
  CodedInputStream *this_local;
  
  this->input_ = input;
  this->buffer_ = (uint8 *)0x0;
  this->buffer_end_ = (uint8 *)0x0;
  this->total_bytes_read_ = 0;
  this->overflow_bytes_ = 0;
  this->last_tag_ = 0;
  this->legitimate_message_end_ = false;
  this->aliasing_enabled_ = false;
  this->current_limit_ = 0x7fffffff;
  this->buffer_size_after_limit_ = 0;
  this->total_bytes_limit_ = 0x4000000;
  this->total_bytes_warning_threshold_ = 0x2000000;
  this->recursion_depth_ = 0;
  this->recursion_limit_ = default_recursion_limit_;
  this->extension_pool_ = (DescriptorPool *)0x0;
  this->extension_factory_ = (MessageFactory *)0x0;
  Refresh(this);
  return;
}

Assistant:

inline CodedInputStream::CodedInputStream(ZeroCopyInputStream* input)
  : input_(input),
    buffer_(NULL),
    buffer_end_(NULL),
    total_bytes_read_(0),
    overflow_bytes_(0),
    last_tag_(0),
    legitimate_message_end_(false),
    aliasing_enabled_(false),
    current_limit_(kint32max),
    buffer_size_after_limit_(0),
    total_bytes_limit_(kDefaultTotalBytesLimit),
    total_bytes_warning_threshold_(kDefaultTotalBytesWarningThreshold),
    recursion_depth_(0),
    recursion_limit_(default_recursion_limit_),
    extension_pool_(NULL),
    extension_factory_(NULL) {
  // Eagerly Refresh() so buffer space is immediately available.
  Refresh();
}